

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitmap_cubical_complex_periodic_boundary_conditions_base.h
# Opt level: O3

void __thiscall
Gudhi::cubical_complex::Bitmap_cubical_complex_periodic_boundary_conditions_base<double>::
impose_lower_star_filtration_from_vertices
          (Bitmap_cubical_complex_periodic_boundary_conditions_base<double> *this)

{
  double dVar1;
  unsigned_long uVar2;
  pointer pdVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  ulong uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  long lVar9;
  pointer puVar10;
  ulong *puVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices_to_consider;
  Vertices_iterator it;
  vector<unsigned_long,_std::allocator<unsigned_long>_> cbd;
  unsigned_long coboundary;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_f8;
  Vertices_iterator local_d8;
  Vertices_iterator local_b0;
  ulong local_90;
  unsigned_long *local_88;
  unsigned_long *local_80;
  vector<bool,_std::allocator<bool>_> local_78;
  Vertices_iterator local_50;
  
  local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d8.counter.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(bool *)&local_d8,
             (allocator_type *)&local_b0);
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (unsigned_long *)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d8.counter,
             (ulong)((long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->super_Bitmap_cubical_complex_base<double>).sizes.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2 & 0xffffffff,
             (allocator_type *)&local_b0);
  local_d8.b = this;
  while( true ) {
    vertices_iterator_end(&local_b0,this);
    bVar7 = Vertices_iterator::operator==(&local_d8,&local_b0);
    if (local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_b0.counter.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_b0.counter.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_b0.counter.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (bVar7) break;
    if ((long)local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (ulong *)0x0;
    }
    else {
      lVar9 = 0;
      local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (ulong *)0x0;
      do {
        local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_b0.counter.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                      (ulong)((local_d8.b)->super_Bitmap_cubical_complex_base<double>).multipliers.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[lVar9] *
                      local_d8.counter.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar9] * 2);
        lVar9 = lVar9 + 1;
      } while ((long)local_d8.counter.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_d8.counter.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3 != lVar9);
    }
    if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                (&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish,(unsigned_long *)&local_b0);
    }
    else {
      *local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish =
           (unsigned_long)
           local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    Vertices_iterator::operator++(&local_50,&local_d8);
    if (local_50.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.counter.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_50.counter.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.counter.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  if (local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_d8.counter.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      local_88 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (unsigned_long *)0x0;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      puVar10 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        uVar2 = *puVar10;
        (*(this->super_Bitmap_cubical_complex_base<double>)._vptr_Bitmap_cubical_complex_base[3])
                  (&local_b0,this,uVar2);
        puVar4 = local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        local_80 = puVar10;
        for (puVar11 = local_b0.counter.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar11 != puVar4; puVar11 = puVar11 + 1) {
          local_90 = *puVar11;
          pdVar3 = (this->super_Bitmap_cubical_complex_base<double>).data.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar1 = pdVar3[uVar2];
          if (pdVar3[local_90] <= dVar1 && dVar1 != pdVar3[local_90]) {
            pdVar3[local_90] = dVar1;
          }
          uVar8 = local_90 + 0x3f;
          if (-1 < (long)local_90) {
            uVar8 = local_90;
          }
          if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar8 >> 6) +
                ((ulong)((local_90 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (local_90 & 0x3f) & 1) == 0) {
            if (local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d8,
                         (iterator)
                         local_d8.counter.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_90);
            }
            else {
              *local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish = local_90;
              local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_d8.counter.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            uVar8 = local_90 + 0x3f;
            if (-1 < (long)local_90) {
              uVar8 = local_90;
            }
            local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p
            [((long)uVar8 >> 6) +
             ((ulong)((local_90 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
                 local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar8 >> 6) +
                  ((ulong)((local_90 & 0x800000000000003f) < 0x8000000000000001) - 1)] |
                 1L << ((byte)local_90 & 0x3f);
          }
        }
        if (local_b0.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start != (ulong *)0x0) {
          operator_delete(local_b0.counter.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_b0.counter.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b0.counter.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        puVar6 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        puVar5 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar4 = local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar10 = local_80 + 1;
      } while (puVar10 != local_88);
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = puVar4;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
      local_d8.counter.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar6;
      if (puVar4 != (unsigned_long *)0x0) {
        operator_delete(puVar4,(long)puVar6 - (long)puVar4);
      }
    } while (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long *)0x0) {
    operator_delete(local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Bitmap_cubical_complex_periodic_boundary_conditions_base<T>::impose_lower_star_filtration_from_vertices() {
  // this vector will be used to check which elements have already been taken care of in imposing lower star filtration
  std::vector<bool> is_this_cell_considered(this->data.size(), false);

  std::vector<std::size_t> indices_to_consider;
  // we assume here that we already have a filtration on the vertices and
  // we have to extend it to higher ones.
  for (auto it = this->vertices_iterator_begin();
       it != this->vertices_iterator_end(); ++it) {
    indices_to_consider.push_back(it.compute_index_in_bitmap());
  }

  while (indices_to_consider.size()) { // Iteration on the dimension
#ifdef DEBUG_TRACES
    std::clog << "indices_to_consider in this iteration \n";
    for (auto index : indices_to_consider) {
      std::clog << index << "  ";
    }
#endif
    std::vector<std::size_t> new_indices_to_consider;
    for (auto index : indices_to_consider) {
      std::vector<std::size_t> cbd = this->get_coboundary_of_a_cell(index);
      for (auto coboundary : cbd) {
#ifdef DEBUG_TRACES
        std::clog << "filtration of a cell : " << coboundary << " is : " << this->data[coboundary]
                  << " while of a cell: " << index << " is: " << this->data[index]
                  << std::endl;
#endif
        if (this->data[coboundary] < this->data[index]) {
          this->data[coboundary] = this->data[index];
#ifdef DEBUG_TRACES
          std::clog << "Setting the value of a cell : " << coboundary
                    << " to : " << this->data[index] << std::endl;
#endif
        }
        if (is_this_cell_considered[coboundary] == false) {
          new_indices_to_consider.push_back(coboundary);
          is_this_cell_considered[coboundary] = true;
        }
      }
    }
    indices_to_consider.swap(new_indices_to_consider);
  }
}